

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSecondaryViewConfigurationFrameEndInfoMSFT *value)

{
  NextChainResult NVar1;
  XrResult XVar2;
  long lVar3;
  XrResult XVar4;
  ulong uVar5;
  allocator local_179;
  GenValidUsageXrInstanceInfo *local_178;
  string *local_170;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_168;
  allocator local_159;
  string local_158;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  string local_f8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar2 = XR_SUCCESS;
  local_178 = instance_info;
  local_170 = command_name;
  local_168 = objects_info;
  if (value->type != XR_TYPE_SECONDARY_VIEW_CONFIGURATION_FRAME_END_INFO_MSFT) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,
               "XrSecondaryViewConfigurationFrameEndInfoMSFT",value->type,
               "VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-type-type",
               XR_TYPE_SECONDARY_VIEW_CONFIGURATION_FRAME_END_INFO_MSFT,
               "XR_TYPE_SECONDARY_VIEW_CONFIGURATION_FRAME_END_INFO_MSFT");
  }
  if (!check_pnext) goto LAB_00164c0f;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar1 = ValidateNextChain(local_178,local_170,local_168,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_158);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_158,local_178,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::string
              ((string *)&local_158,"VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-next-unique",
               &local_179);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_78,local_168);
    std::__cxx11::string::string
              ((string *)&local_f8,
               "Multiple structures of the same type(s) in \"next\" chain for XrSecondaryViewConfigurationFrameEndInfoMSFT struct"
               ,&local_159);
    CoreValidLogMessage(local_178,&local_158,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_170,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_78,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_78);
    std::__cxx11::string::~string((string *)&local_158);
LAB_00164bdd:
    std::__cxx11::string::~string((string *)&error_message);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-next-next",(allocator *)&local_f8)
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,local_168);
    std::__cxx11::string::string
              ((string *)&local_158,
               "Invalid structure(s) in \"next\" chain for XrSecondaryViewConfigurationFrameEndInfoMSFT struct \"next\""
               ,&local_179);
    CoreValidLogMessage(local_178,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_170,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_60);
    goto LAB_00164bdd;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_00164c0f:
  if (check_members && XVar2 == XR_SUCCESS) {
    XVar2 = XR_SUCCESS;
    if ((value->viewConfigurationCount == 0) &&
       (value->viewConfigurationLayersInfo != (XrSecondaryViewConfigurationLayerInfoMSFT *)0x0)) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-viewConfigurationCount-arraylength"
                 ,(allocator *)&local_f8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_90,local_168);
      std::__cxx11::string::string
                ((string *)&local_158,
                 "Structure XrSecondaryViewConfigurationFrameEndInfoMSFT member viewConfigurationCount is non-optional and must be greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_178,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_170,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_90,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_90);
      std::__cxx11::string::~string((string *)&error_message);
      XVar2 = XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->viewConfigurationLayersInfo == (XrSecondaryViewConfigurationLayerInfoMSFT *)0x0) {
      if (value->viewConfigurationCount != 0) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-viewConfigurationLayersInfo-parameter"
                   ,(allocator *)&local_f8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_a8,local_168);
        std::__cxx11::string::string
                  ((string *)&local_158,
                   "XrSecondaryViewConfigurationFrameEndInfoMSFT contains invalid NULL for XrSecondaryViewConfigurationLayerInfoMSFT \"viewConfigurationLayersInfo\" is which not optional since \"viewConfigurationCount\" is set and must be non-NULL"
                   ,(allocator *)&valid_ext_structs);
        CoreValidLogMessage(local_178,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_170,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_a8,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_a8);
        std::__cxx11::string::~string((string *)&error_message);
        XVar2 = XR_ERROR_VALIDATION_FAILURE;
      }
    }
    else {
      uVar5 = 0xffffffffffffffff;
      lVar3 = 0;
      XVar4 = XVar2;
      do {
        uVar5 = uVar5 + 1;
        if (value->viewConfigurationCount <= uVar5) {
          return XVar4;
        }
        XVar2 = ValidateXrStruct(local_178,local_170,local_168,true,true,
                                 (XrSecondaryViewConfigurationLayerInfoMSFT *)
                                 ((long)&value->viewConfigurationLayersInfo->type + lVar3));
        XVar4 = XR_SUCCESS;
        lVar3 = lVar3 + 0x28;
      } while (XVar2 == XR_SUCCESS);
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-viewConfigurationLayersInfo-parameter"
                 ,(allocator *)&local_f8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_c0,local_168);
      std::__cxx11::string::string
                ((string *)&local_158,
                 "Structure XrSecondaryViewConfigurationFrameEndInfoMSFT member viewConfigurationLayersInfo is invalid"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_178,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_170,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_c0,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_c0);
      std::__cxx11::string::~string((string *)&error_message);
    }
  }
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSecondaryViewConfigurationFrameEndInfoMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SECONDARY_VIEW_CONFIGURATION_FRAME_END_INFO_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSecondaryViewConfigurationFrameEndInfoMSFT",
                             value->type, "VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-type-type", XR_TYPE_SECONDARY_VIEW_CONFIGURATION_FRAME_END_INFO_MSFT, "XR_TYPE_SECONDARY_VIEW_CONFIGURATION_FRAME_END_INFO_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSecondaryViewConfigurationFrameEndInfoMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSecondaryViewConfigurationFrameEndInfoMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSecondaryViewConfigurationFrameEndInfoMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->viewConfigurationCount && nullptr != value->viewConfigurationLayersInfo) {
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-viewConfigurationCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSecondaryViewConfigurationFrameEndInfoMSFT member viewConfigurationCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->viewConfigurationLayersInfo && 0 != value->viewConfigurationCount) {
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-viewConfigurationLayersInfo-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrSecondaryViewConfigurationFrameEndInfoMSFT contains invalid NULL for XrSecondaryViewConfigurationLayerInfoMSFT \"viewConfigurationLayersInfo\" is which not "
                            "optional since \"viewConfigurationCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->viewConfigurationLayersInfo) {
        for (uint32_t value_viewconfigurationlayersinfo_inc = 0; value_viewconfigurationlayersinfo_inc < value->viewConfigurationCount; ++value_viewconfigurationlayersinfo_inc) {
            // Validate that the structure XrSecondaryViewConfigurationLayerInfoMSFT is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->viewConfigurationLayersInfo[value_viewconfigurationlayersinfo_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationFrameEndInfoMSFT-viewConfigurationLayersInfo-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrSecondaryViewConfigurationFrameEndInfoMSFT member viewConfigurationLayersInfo is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}